

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_io_add_(event_base *base,int fd,event *ev)

{
  eventop *peVar1;
  event **ppeVar2;
  event *peVar3;
  bool bVar4;
  int iVar5;
  event_signal_map *map;
  void *pvVar6;
  void *extra;
  event *old_ev;
  int local_50;
  short old;
  short res;
  int retval;
  int nclose;
  int nwrite;
  int nread;
  evmap_io *ctx;
  event_signal_map *io;
  eventop *evsel;
  event *ev_local;
  int fd_local;
  event_base *base_local;
  
  peVar1 = base->evsel;
  map = &base->io;
  local_50 = 0;
  old_ev._6_2_ = 0;
  old_ev._4_2_ = 0;
  if (fd != ev->ev_fd) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
               ,0x11a,"fd == ev->ev_fd","evmap_io_add_");
  }
  if (fd < 0) {
    base_local._4_4_ = 0;
  }
  else if ((fd < (base->io).nentries) || (iVar5 = evmap_make_space(map,fd,8), iVar5 != -1)) {
    if (map->entries[fd] == (void *)0x0) {
      pvVar6 = event_mm_calloc_(1,peVar1->fdinfo_len + 0x10);
      map->entries[fd] = pvVar6;
      if (map->entries[fd] == (void *)0x0) {
        return -1;
      }
      evmap_io_init((evmap_io *)map->entries[fd]);
    }
    ppeVar2 = (event **)map->entries[fd];
    nclose = (int)*(ushort *)(ppeVar2 + 1);
    retval = (int)*(ushort *)((long)ppeVar2 + 10);
    _old = (uint)*(ushort *)((long)ppeVar2 + 0xc);
    if (nclose != 0) {
      old_ev._4_2_ = 2;
    }
    if (retval != 0) {
      old_ev._4_2_ = old_ev._4_2_ | 4;
    }
    if (_old != 0) {
      old_ev._4_2_ = old_ev._4_2_ | 0x80;
    }
    if (((ev->ev_events & 2U) != 0) && (nclose = nclose + 1, nclose == 1)) {
      old_ev._6_2_ = 2;
    }
    if (((ev->ev_events & 4U) != 0) && (retval = retval + 1, retval == 1)) {
      old_ev._6_2_ = old_ev._6_2_ | 4;
    }
    if (((ev->ev_events & 0x80U) != 0) && (_old = _old + 1, _old == 1)) {
      old_ev._6_2_ = old_ev._6_2_ | 0x80;
    }
    bVar4 = true;
    if (((uint)nclose < 0x10000) && (bVar4 = true, (uint)retval < 0x10000)) {
      bVar4 = 0xffff < _old;
    }
    if (bVar4) {
      event_warnx("Too many events reading or writing on fd %d",(ulong)(uint)fd);
      base_local._4_4_ = -1;
    }
    else if (((event_debug_mode_on_ == 0) || (*ppeVar2 == (event *)0x0)) ||
            (((*ppeVar2)->ev_events & 0x20U) == (ev->ev_events & 0x20U))) {
      if (old_ev._6_2_ != 0) {
        iVar5 = (*peVar1->add)(base,ev->ev_fd,old_ev._4_2_,ev->ev_events & 0x20U | old_ev._6_2_,
                               ppeVar2 + 2);
        if (iVar5 == -1) {
          return -1;
        }
        local_50 = 1;
      }
      *(short *)(ppeVar2 + 1) = (short)nclose;
      *(short *)((long)ppeVar2 + 10) = (short)retval;
      *(short *)((long)ppeVar2 + 0xc) = (short)_old;
      peVar3 = *ppeVar2;
      (ev->ev_).ev_io.ev_io_next.le_next = peVar3;
      if (peVar3 != (event *)0x0) {
        ((*ppeVar2)->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
      }
      *ppeVar2 = ev;
      (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar2;
      base_local._4_4_ = local_50;
    }
    else {
      event_warnx("Tried to mix edge-triggered and non-edge-triggered events on fd %d",
                  (ulong)(uint)fd);
      base_local._4_4_ = -1;
    }
  }
  else {
    base_local._4_4_ = -1;
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_io_add_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx = NULL;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;
	struct event *old_ev;

	EVUTIL_ASSERT(fd == ev->ev_fd);

	if (fd < 0)
		return 0;

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries) {
		if (evmap_make_space(io, fd, sizeof(struct evmap_io *)) == -1)
			return (-1);
	}
#endif
	GET_IO_SLOT_AND_CTOR(ctx, io, fd, evmap_io, evmap_io_init,
						 evsel->fdinfo_len);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (++nread == 1)
			res |= EV_READ;
	}
	if (ev->ev_events & EV_WRITE) {
		if (++nwrite == 1)
			res |= EV_WRITE;
	}
	if (ev->ev_events & EV_CLOSED) {
		if (++nclose == 1)
			res |= EV_CLOSED;
	}
	if (EVUTIL_UNLIKELY(nread > 0xffff || nwrite > 0xffff || nclose > 0xffff)) {
		event_warnx("Too many events reading or writing on fd %d",
		    (int)fd);
		return -1;
	}
	if (EVENT_DEBUG_MODE_IS_ON() &&
	    (old_ev = LIST_FIRST(&ctx->events)) &&
	    (old_ev->ev_events&EV_ET) != (ev->ev_events&EV_ET)) {
		event_warnx("Tried to mix edge-triggered and non-edge-triggered"
		    " events on fd %d", (int)fd);
		return -1;
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		/* XXX(niels): we cannot mix edge-triggered and
		 * level-triggered, we should probably assert on
		 * this. */
		if (evsel->add(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1)
			return (-1);
		retval = 1;
	}

	ctx->nread = (ev_uint16_t) nread;
	ctx->nwrite = (ev_uint16_t) nwrite;
	ctx->nclose = (ev_uint16_t) nclose;
	LIST_INSERT_HEAD(&ctx->events, ev, ev_io_next);

	return (retval);
}